

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_subgraph
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *sub)

{
  bool bVar1;
  reference this_00;
  undefined8 in_RSI;
  DependenceGraph<dg::LLVMNode> *in_RDI;
  int unaff_retaddr;
  pair<llvm::Value_*const,_dg::LLVMNode_*> *I_1;
  iterator __end0_1;
  iterator __begin0_1;
  DependenceGraph<dg::LLVMNode> *__range3_1;
  pair<llvm::Value_*const,_dg::LLVMNode_*> *I;
  iterator __end0;
  iterator __begin0;
  DependenceGraph<dg::LLVMNode> *__range3;
  DependenceGraph<dg::LLVMNode> *in_stack_00000058;
  DG2Dot<dg::LLVMNode> *in_stack_00000060;
  int in_stack_00000074;
  LLVMNode *in_stack_00000078;
  DG2Dot<dg::LLVMNode> *in_stack_00000080;
  _Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *in_stack_ffffffffffffffb0;
  _Self local_48;
  _Self in_stack_ffffffffffffffc0;
  DependenceGraph<dg::LLVMNode> *in_stack_ffffffffffffffc8;
  DG2Dot<dg::LLVMNode> *in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self local_20;
  undefined8 local_18;
  undefined8 local_10;
  DependenceGraph<dg::LLVMNode> *prefix;
  
  local_10 = in_RSI;
  prefix = in_RDI;
  dumpSubgraphStart(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                    (char *)in_stack_ffffffffffffffc0._M_node);
  dumpBBs((DG2Dot<dg::LLVMNode> *)__range3_1,(DependenceGraph<dg::LLVMNode> *)__begin0_1._M_node,
          __end0_1._M_node._4_4_);
  local_18 = local_10;
  local_20._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::begin(in_RDI);
  local_28._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator*
              ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)0x1c947f);
    dump_node((DG2Dot<dg::LLVMNode> *)CONCAT44(__end0_1._M_node._4_4_,__end0_1._M_node._0_4_),
              (LLVMNode *)I_1,unaff_retaddr,(char *)prefix);
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
              (in_stack_ffffffffffffffb0);
  }
  DependenceGraph<dg::LLVMNode>::begin(in_RDI);
  local_48._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffc0,&local_48);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator*
                        ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
                         0x1c94f2);
    dump_node_edges(in_stack_00000080,in_stack_00000078,in_stack_00000074);
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)this_00);
  }
  dumpSubgraphEnd(in_stack_00000060,in_stack_00000058,this._7_1_);
  return;
}

Assistant:

void dump_subgraph(DependenceGraph<NodeT> *sub) {
        dumpSubgraphStart(sub);

#ifdef ENABLE_CFG
        // dump BBs in the subgraph
        dumpBBs(sub, 2);
#endif

        // dump all nodes again, if there is any that is
        // not in any BB
        for (auto &I : *sub)
            dump_node(I.second, 2);
        // dump edges between nodes
        for (auto &I : *sub)
            dump_node_edges(I.second, 2);

        dumpSubgraphEnd(sub);
    }